

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O0

void __thiscall App::keyReleased(App *this,int key)

{
  int key_local;
  App *this_local;
  
  if (key == 0x20) goto LAB_0016479b;
  if (key == 0x41) {
LAB_00164770:
    Character::stopRunning(&this->character,true);
    return;
  }
  if (key == 0x44) {
LAB_00164787:
    Character::stopRunning(&this->character,false);
  }
  else {
    if (key == 0x53) {
LAB_001647ad:
      Character::stopDucking(&this->character);
      return;
    }
    if (key != 0x57) {
      if (key == 0x106) goto LAB_00164787;
      if (key == 0x107) goto LAB_00164770;
      if (key == 0x108) goto LAB_001647ad;
      if (key != 0x109) {
        return;
      }
    }
LAB_0016479b:
    Character::stopJumping(&this->character);
  }
  return;
}

Assistant:

void App::keyReleased(int key) {
    switch (key) {
        case 263: // left arrow
        case 'A':
            character.stopRunning(true);
            break;
        case 262: // right arrow
        case 'D':
            character.stopRunning(false);
            break;
        case 265: // up arrow
        case 'W':
        case ' ':
            character.stopJumping();
            break;
        case 264: // down arrow
        case 'S':
            character.stopDucking();
            break;
    }
}